

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall
el::base::utils::RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>::
~RegistryWithPred(RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this)

{
  pointer ppHVar1;
  
  (this->
  super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  ).super_ThreadSafe._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_0012a9a8;
  unregisterAll(this);
  (this->
  super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  ).super_ThreadSafe._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_0012aa40;
  ppHVar1 = (this->
            super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
            ).m_list.
            super__Vector_base<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppHVar1 != (pointer)0x0) {
    operator_delete(ppHVar1);
    return;
  }
  return;
}

Assistant:

virtual ~RegistryWithPred(void) {
    unregisterAll();
  }